

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

TArray<FName,_FName> * MakeStateNameList(char *fname)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *__s;
  char *pcVar5;
  int iVar6;
  
  if ((MakeStateNameList(char_const*)::namelist == '\0') &&
     (iVar4 = __cxa_guard_acquire(&MakeStateNameList(char_const*)::namelist), iVar4 != 0)) {
    MakeStateNameList::namelist.Most = 3;
    MakeStateNameList::namelist.Count = 0;
    MakeStateNameList::namelist.Array =
         (FName *)M_Malloc_Dbg(0xc,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                               ,0x8c);
    __cxa_atexit(TArray<FName,_FName>::~TArray,&MakeStateNameList::namelist,&__dso_handle);
    __cxa_guard_release(&MakeStateNameList(char_const*)::namelist);
  }
  __s = copystring(fname);
  pcVar5 = strtok(__s,".");
  iVar6 = 0;
  iVar3 = FName::NameManager::FindName(&FName::NameData,pcVar5,false);
  bVar1 = true;
  iVar4 = iVar3;
  if (iVar3 < 0x9d) {
    if (iVar3 == 0x33) {
LAB_00456160:
      bVar1 = false;
      iVar4 = 0x8c;
      iVar6 = iVar3;
      goto LAB_0045617b;
    }
    iVar6 = 0;
    if (iVar3 != 0x9c) goto LAB_0045617b;
    iVar6 = 0xce;
  }
  else {
    if (iVar3 != 0x9d) {
      if (iVar3 != 0x9e) goto LAB_0045617b;
      goto LAB_00456160;
    }
    iVar6 = 0xa4;
  }
  bVar1 = false;
  iVar4 = 0x8c;
LAB_0045617b:
  if (MakeStateNameList::namelist.Count != 0) {
    MakeStateNameList::namelist._8_8_ = MakeStateNameList::namelist._8_8_ & 0xffffffff;
  }
  TArray<FName,_FName>::Grow(&MakeStateNameList::namelist,1);
  uVar2 = MakeStateNameList::namelist.Count;
  MakeStateNameList::namelist.Array[MakeStateNameList::namelist.Count].Index = iVar4;
  MakeStateNameList::namelist.Count = uVar2 + 1;
  if (!bVar1) {
    TArray<FName,_FName>::Grow(&MakeStateNameList::namelist,1);
    MakeStateNameList::namelist.Array[MakeStateNameList::namelist.Count].Index = iVar6;
    MakeStateNameList::namelist.Count = MakeStateNameList::namelist.Count + 1;
  }
  pcVar5 = strtok((char *)0x0,".");
  while (pcVar5 != (char *)0x0) {
    iVar4 = FName::NameManager::FindName(&FName::NameData,pcVar5,false);
    TArray<FName,_FName>::Grow(&MakeStateNameList::namelist,1);
    MakeStateNameList::namelist.Array[MakeStateNameList::namelist.Count].Index = iVar4;
    MakeStateNameList::namelist.Count = MakeStateNameList::namelist.Count + 1;
    pcVar5 = strtok((char *)0x0,".");
  }
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  return &MakeStateNameList::namelist;
}

Assistant:

TArray<FName> &MakeStateNameList(const char * fname)
{
	static TArray<FName> namelist(3);
	FName firstpart, secondpart;
	char *c;

	// Handle the old names for the existing death states
	char *name = copystring(fname);
	firstpart = strtok(name, ".");
	switch (firstpart)
	{
	case NAME_Burn:
		firstpart = NAME_Death;
		secondpart = NAME_Fire;
		break;
	case NAME_Ice:
		firstpart = NAME_Death;
		secondpart = NAME_Ice;
		break;
	case NAME_Disintegrate:
		firstpart = NAME_Death;
		secondpart = NAME_Disintegrate;
		break;
	case NAME_XDeath:
		firstpart = NAME_Death;
		secondpart = NAME_Extreme;
		break;
	}

	namelist.Clear();
	namelist.Push(firstpart);
	if (secondpart != NAME_None)
	{
		namelist.Push(secondpart);
	}

	while ((c = strtok(NULL, ".")) != NULL)
	{
		FName cc = c;
		namelist.Push(cc);
	}
	delete[] name;
	return namelist;
}